

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBoundariesState::PeerBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  data_ptr_t __s;
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  reference pvVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t n;
  idx_t local_38;
  
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  __s = pvVar3->data;
  if (this->partition_count + this->order_count == 0) {
    if (count != 0) {
      switchD_005681f0::default(__s,0,count << 3);
      return;
    }
  }
  else if (count != 0) {
    puVar1 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar2 = (order_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar5 = 0;
    do {
      iVar4 = row_idx;
      if ((puVar1[row_idx >> 6] >> (row_idx & 0x3f) & 1) == 0) {
        if ((is_jump & 1U) != 0) goto LAB_00cb689e;
        if ((puVar2[row_idx >> 6] & 1L << ((byte)row_idx & 0x3f)) == 0) {
          iVar4 = this->peer_start;
        }
        else {
          this->peer_start = row_idx;
        }
      }
      else if ((is_jump & 1U) == 0) {
        this->peer_start = row_idx;
        is_jump = false;
      }
      else {
LAB_00cb689e:
        local_38 = 1;
        is_jump = false;
        iVar4 = FindPrevStart(order_mask,0,row_idx + 1,&local_38);
        this->peer_start = iVar4;
      }
      *(idx_t *)(__s + iVar5 * 8) = iVar4;
      iVar5 = iVar5 + 1;
      row_idx = row_idx + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

void WindowBoundariesState::PeerBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                      const ValidityMask &partition_mask, const ValidityMask &order_mask) {

	auto peer_begin_data = FlatVector::GetData<idx_t>(bounds.data[PEER_BEGIN]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			peer_begin_data[chunk_idx] = 0;
		}
		return;
	}

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);
		const auto is_peer = !order_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			// find end of partition
			if (is_jump) {
				idx_t n = 1;
				peer_start = FindPrevStart(order_mask, 0, row_idx + 1, n);
			} else {
				peer_start = row_idx;
			}
			is_jump = false;
		} else if (!is_peer) {
			peer_start = row_idx;
		}

		peer_begin_data[chunk_idx] = peer_start;
	}
}